

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_deserialize_set_element
          (t_java_generator *this,ostream *out,t_set *tset,string *prefix,string *obj,
          bool has_metadata)

{
  uint uVar1;
  t_type *ptVar2;
  ostream *poVar3;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  undefined1 local_1a0 [8];
  string i;
  string local_160;
  undefined1 local_140 [8];
  t_field felem;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  string elem;
  bool has_metadata_local;
  string *obj_local;
  string *prefix_local;
  t_set *tset_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  elem.field_2._M_local_buf[0xf] = has_metadata;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"_elem",&local_79);
  t_generator::tmp((string *)local_58,(t_generator *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ptVar2 = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_160,(string *)local_58);
  t_field::t_field((t_field *)local_140,ptVar2,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  poVar3 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_
            ((string *)((long)&i.field_2 + 8),this,(t_field *)local_140,
             (bool)(this->reuse_objects_ & 1),false);
  poVar3 = std::operator<<(poVar3,(string *)(i.field_2._M_local_buf + 8));
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"_i",&local_1c1);
  t_generator::tmp((string *)local_1a0,(t_generator *)this,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"for (int ");
  poVar3 = std::operator<<(poVar3,(string *)local_1a0);
  poVar3 = std::operator<<(poVar3," = 0; ");
  poVar3 = std::operator<<(poVar3,(string *)local_1a0);
  poVar3 = std::operator<<(poVar3," < ");
  poVar3 = std::operator<<(poVar3,(string *)obj);
  poVar3 = std::operator<<(poVar3,".size");
  poVar3 = std::operator<<(poVar3,"; ");
  poVar3 = std::operator<<(poVar3,"++");
  poVar3 = std::operator<<(poVar3,(string *)local_1a0);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"",&local_1e9);
  generate_deserialize_field
            (this,out,(t_field *)local_140,&local_1e8,(bool)(elem.field_2._M_local_buf[0xf] & 1));
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  ptVar2 = t_field::get_type((t_field *)local_140);
  ptVar2 = t_generator::get_true_type(ptVar2);
  uVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])();
  if ((uVar1 & 1) != 0) {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"if (");
    poVar3 = std::operator<<(poVar3,(string *)local_58);
    poVar3 = std::operator<<(poVar3," != null)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3,".add(");
  poVar3 = std::operator<<(poVar3,(string *)local_58);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  ptVar2 = t_field::get_type((t_field *)local_140);
  ptVar2 = t_generator::get_true_type(ptVar2);
  uVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])();
  if ((uVar1 & 1) != 0) {
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  if ((this->reuse_objects_ & 1U) != 0) {
    ptVar2 = t_field::get_type((t_field *)local_140);
    ptVar2 = t_generator::get_true_type(ptVar2);
    uVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,(string *)local_58);
      poVar3 = std::operator<<(poVar3," = null;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  std::__cxx11::string::~string((string *)local_1a0);
  t_field::~t_field((t_field *)local_140);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void t_java_generator::generate_deserialize_set_element(ostream& out,
                                                        t_set* tset,
                                                        string prefix,
                                                        string obj,
                                                        bool has_metadata) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << declare_field(&felem, reuse_objects_, false) << endl;

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (int " << i << " = 0; " << i << " < " << obj << ".size"
              << "; "
              << "++" << i << ")" << endl;
  scope_up(out);

  generate_deserialize_field(out, &felem, "", has_metadata);

  if (get_true_type(felem.get_type())->is_enum()) {
    indent(out) << "if (" << elem << " != null)" << endl;
    scope_up(out);
  }

  indent(out) << prefix << ".add(" << elem << ");" << endl;

  if (get_true_type(felem.get_type())->is_enum()) {
    scope_down(out);
  }

  if (reuse_objects_ && !get_true_type(felem.get_type())->is_base_type()) {
    indent(out) << elem << " = null;" << endl;
  }
}